

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Stream.cpp
# Opt level: O1

void __thiscall FBX::Stream::~Stream(Stream *this)

{
  pointer pcVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  
  munmap(this->data,this->fileSize);
  pcVar1 = (this->path)._M_dataplus._M_p;
  paVar2 = &(this->path).field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)pcVar1 != paVar2) {
    operator_delete(pcVar1,paVar2->_M_allocated_capacity + 1);
    return;
  }
  return;
}

Assistant:

Stream::~Stream() {
#if defined(__unix__) || defined(__APPLE__)
        munmap(data, fileSize);
#elif __WIN32__
        UnmapViewOfFile(data);
        CloseHandle(map);
        CloseHandle(file);
#endif
    }